

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O2

void xyz2rgb(Triplet *in_out)

{
  double dVar1;
  double dVar2;
  double local_18;
  
  dVar1 = dot_product(m,in_out);
  if (dVar1 <= 0.0031308) {
    dVar1 = dVar1 * 12.92;
  }
  else {
    dVar1 = pow(dVar1,0.4166666666666667);
    dVar1 = dVar1 * 1.055 + -0.055;
  }
  local_18 = dot_product(m + 1,in_out);
  if (local_18 <= 0.0031308) {
    local_18 = local_18 * 12.92;
  }
  else {
    dVar2 = pow(local_18,0.4166666666666667);
    local_18 = dVar2 * 1.055 + -0.055;
  }
  dVar2 = dot_product(m + 2,in_out);
  if (dVar2 <= 0.0031308) {
    dVar2 = dVar2 * 12.92;
  }
  else {
    dVar2 = pow(dVar2,0.4166666666666667);
    dVar2 = dVar2 * 1.055 + -0.055;
  }
  in_out->a = dVar1;
  in_out->b = local_18;
  in_out->c = dVar2;
  return;
}

Assistant:

static void
xyz2rgb(Triplet* in_out)
{
    double r = from_linear(dot_product(&m[0], in_out));
    double g = from_linear(dot_product(&m[1], in_out));
    double b = from_linear(dot_product(&m[2], in_out));
    in_out->a = r;
    in_out->b = g;
    in_out->c = b;
}